

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.hpp
# Opt level: O3

void __thiscall
type_safe::
basic_variant<type_safe::detail::non_empty_variant_policy<false>,int,evil_variant_test_type>::
emplace_impl<evil_variant_test_type,double>
          (basic_variant<type_safe::detail::non_empty_variant_policy<false>,int,evil_variant_test_type>
           *this)

{
  evil_variant_test_type tmp;
  evil_variant_test_type local_11;
  
  if (*(long *)(this + 8) == 0) {
    *this = (basic_variant<type_safe::detail::non_empty_variant_policy<false>,int,evil_variant_test_type>
             )0x1;
  }
  else {
    detail::destroy_union<type_safe::tagged_union<int,_evil_variant_test_type>_>::destroy
              ((tagged_union<int,_evil_variant_test_type> *)this);
    evil_variant_test_type::evil_variant_test_type((evil_variant_test_type *)this,&local_11);
  }
  *(undefined8 *)(this + 8) = 2;
  return;
}

Assistant:

void emplace_impl(variant_type<T> type, Args&&... args)
    {
        if (storage_.get_union().has_value())
            VariantPolicy::change_value(type, storage_.get_union(), std::forward<Args>(args)...);
        else
            storage_.get_union().emplace(type, std::forward<Args>(args)...);
    }